

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# post_function.cc
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  cvector *v;
  allocator<int> *this;
  single_discrete_match<3> local_ed;
  int local_ec;
  int local_e8;
  int hits;
  int step;
  undefined1 local_b8 [8];
  int desired;
  vector<int,_std::allocator<int>_> input;
  int *inp_end;
  int *inp_beg;
  int i;
  vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
  local_78;
  undefined1 local_58 [8];
  teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
  teacher;
  mvn neuron;
  
  klogic::mvn::mvn((mvn *)&teacher.field_0x20,3,2);
  local_78.
  super__Vector_base<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
  ::vector(&local_78);
  klogic::learning::
  teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
  ::teacher((teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
             *)local_58,(mvn *)&teacher.field_0x20,&local_78);
  std::
  vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
  ::~vector(&local_78);
  for (inp_beg._0_4_ = 0; (int)inp_beg < 9; inp_beg._0_4_ = (int)inp_beg + 1) {
    lVar3 = (long)(int)inp_beg;
    this = (allocator<int> *)(local_b8 + 7);
    input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = learning_samples[lVar3] + 2;
    std::allocator<int>::allocator(this);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&desired,learning_samples[lVar3],
               learning_samples[lVar3] + 2,this);
    std::allocator<int>::~allocator((allocator<int> *)(local_b8 + 7));
    local_b8._0_4_ = learning_samples[lVar3][2];
    klogic::transform::discrete<3,std::complex<double>,int>
              ((sample<std::complex<double>_> *)&step,(transform *)&desired,
               (vector<int,_std::allocator<int>_> *)local_b8,(int *)this);
    klogic::learning::
    teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
    ::add_sample((teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
                  *)local_58,(sample<std::complex<double>_> *)&step);
    klogic::learning::sample<std::complex<double>_>::~sample((sample<std::complex<double>_> *)&step)
    ;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&desired);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Before hits: ");
  iVar1 = klogic::learning::
          teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
          ::hits<klogic::learning::single_discrete_match<3>>
                    ((teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
                      *)local_58,(single_discrete_match<3> *)((long)&hits + 3));
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_e8 = 1;
  while( true ) {
    klogic::learning::
    teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
    ::learn_run((teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
                 *)local_58);
    local_ec = klogic::learning::
               teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
               ::hits<klogic::learning::single_discrete_match<3>>
                         ((teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
                           *)local_58,&local_ed);
    poVar4 = std::operator<<((ostream *)&std::cout,"After step ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_e8);
    poVar4 = std::operator<<(poVar4," hits: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_ec);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar1 = local_ec;
    iVar2 = klogic::learning::
            teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
            ::samples_count((teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
                             *)local_58);
    if (iVar1 == iVar2) break;
    local_e8 = local_e8 + 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"MVN weights:");
  pbVar5 = (basic_ostream<char,_std::char_traits<char>_> *)
           std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  v = klogic::mvn::weights_vector((mvn *)&teacher.field_0x20);
  pbVar5 = klogic::operator<<(pbVar5,v);
  std::ostream::operator<<((ostream *)pbVar5,std::endl<char,std::char_traits<char>>);
  klogic::learning::
  teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
  ::~teacher((teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
              *)local_58);
  klogic::mvn::~mvn((mvn *)&teacher.field_0x20);
  return 0;
}

Assistant:

int main()
{
    using namespace std;
    using namespace klogic;
    using namespace klogic::learning;
    using namespace klogic::transform;

    mvn neuron(K, 2);
    teacher<mvn> teacher(neuron);

    for (int i = 0; i < nsamples; ++i) {
        const int *inp_beg = &learning_samples[i][0], *inp_end = inp_beg + 2;
        vector<int> input(inp_beg, inp_end);
        int desired = inp_beg[2];

        teacher.add_sample(discrete<K, cmplx>(input, desired));
    }

    // cout << "Samples:" << endl << teacher.samples() << endl;

    cout << "Before hits: " << teacher.hits<single_discrete_match<K> >() << endl;

    for (int step = 1;; ++step) {
        // cout << "MVN weights:" << endl << neuron.weights_vector() << endl;

        teacher.learn_run();

        int hits = teacher.hits<single_discrete_match<K> >();

        cout << "After step " << step << " hits: " << hits << endl;

        if (hits == teacher.samples_count())
            break;
    }

    cout << "MVN weights:" << endl << neuron.weights_vector() << endl;

    return 0;
}